

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_gather_offsets
               (NegativeTestContext *ctx)

{
  DataType DVar1;
  int iVar2;
  bool *pbVar3;
  bool bVar4;
  ContextType CVar5;
  char *pcVar6;
  ostream *poVar7;
  NotSupportedError *this;
  ShaderType SVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  allocator<char> local_47f;
  allocator<char> local_47e;
  allocator<char> local_47d;
  ShaderType local_47c;
  long local_478;
  string local_470;
  long local_450;
  ostream *local_448;
  string local_440;
  string shaderSource;
  string local_400;
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  ostream local_320;
  ostringstream source;
  
  CVar5.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(CVar5,(ApiType)0x23);
  if (!bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"GL_EXT_gpu_shader5",(allocator<char> *)&local_320);
    bVar4 = NegativeTestContext::isExtensionSupported(ctx,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    if (!bVar4) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"This test requires a context version 3.2 or higher.",
                 "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(\"GL_EXT_gpu_shader5\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderFunctionTests.cpp"
                 ,0x10c3);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,"textureGatherOffsets",(allocator<char> *)&source);
  NegativeTestContext::beginSection(ctx,(string *)&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  lVar10 = 0;
  do {
    if (lVar10 == 6) {
      NegativeTestContext::endSection(ctx);
      return;
    }
    pcVar9 = "";
    SVar8 = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar10];
    bVar4 = NegativeTestContext::isShaderSupported(ctx,SVar8);
    if (bVar4) {
      local_47c = SVar8;
      local_450 = lVar10;
      pcVar6 = glu::getShaderTypeName(SVar8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&source,pcVar6,(allocator<char> *)&local_470);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320
                     ,"Verify shader: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source);
      NegativeTestContext::beginSection
                (ctx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320
                );
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&source);
      local_478 = 0;
      while( true ) {
        SVar8 = (ShaderType)pcVar9;
        if (local_478 == 0x1c) break;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
        CVar5.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar4 = glu::contextSupports(CVar5,(ApiType)0x23);
        pcVar9 = glu::getGLSLVersionDeclaration(bVar4 | GLSL_VERSION_310_ES);
        poVar7 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,pcVar9);
        poVar7 = std::operator<<(poVar7,"\n");
        NegativeTestShared::(anonymous_namespace)::getShaderInitialization_abi_cxx11_
                  (&local_470,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)local_47c,
                   SVar8);
        poVar7 = std::operator<<(poVar7,(string *)&local_470);
        lVar10 = local_478 * 0x1c;
        DVar1 = *(DataType *)(&DAT_018d0d84 + lVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_360,"sampler",&local_47d);
        declareShaderUniform(&local_440,DVar1,&local_360);
        poVar7 = std::operator<<(poVar7,(string *)&local_440);
        poVar7 = std::operator<<(poVar7,"void main(void)\n");
        poVar7 = std::operator<<(poVar7,"{\n");
        poVar7 = std::operator<<(poVar7,"\tmediump ");
        DVar1 = *(DataType *)(&DAT_018d0d88 + lVar10);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"P",&local_47e);
        declareAndInitializeShaderVariable(&local_380,DVar1,&local_3a0);
        poVar7 = std::operator<<(poVar7,(string *)&local_380);
        poVar7 = std::operator<<(poVar7,"    mediump ");
        pbVar3 = glcts::fixed_sample_locations_values;
        pcVar9 = "const ";
        if ((&DAT_018d0d94)[lVar10] != '\0') {
          pbVar3 = (bool *)"\tconst ";
        }
        local_448 = std::operator<<(poVar7,pbVar3 + 1);
        DVar1 = *(DataType *)(&DAT_018d0d8c + lVar10);
        std::__cxx11::string::string<std::allocator<char>>(local_3e0,"offsets",&local_47f);
        iVar2 = *(int *)(&DAT_018d0d98 + lVar10);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
        pcVar6 = glu::getDataTypeName(DVar1);
        poVar7 = std::operator<<(&local_320,pcVar6);
        poVar7 = std::operator<<(poVar7," ");
        poVar7 = std::operator<<(poVar7,local_3e0);
        poVar7 = std::operator<<(poVar7,"[");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar2);
        poVar7 = std::operator<<(poVar7,"]");
        poVar7 = std::operator<<(poVar7," = ");
        pcVar6 = glu::getDataTypeName(DVar1);
        poVar7 = std::operator<<(poVar7,pcVar6);
        std::operator<<(poVar7,"[](");
        iVar12 = 0;
        iVar11 = iVar2;
        if (iVar2 < 1) {
          iVar11 = iVar12;
        }
        for (; iVar11 != iVar12; iVar12 = iVar12 + 1) {
          pcVar6 = glu::getDataTypeName(DVar1);
          poVar7 = std::operator<<(&local_320,pcVar6);
          poVar7 = std::operator<<(poVar7,"(");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
          poVar7 = std::operator<<(poVar7,", ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
          poVar7 = std::operator<<(poVar7,")");
          pbVar3 = glcts::fixed_sample_locations_values;
          if (iVar12 < iVar2 + -1) {
            pbVar3 = (bool *)" , ";
          }
          std::operator<<(poVar7,pbVar3 + 1);
        }
        std::operator<<(&local_320,");");
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
        poVar7 = std::operator<<(local_448,local_3c0);
        std::operator<<(poVar7,"\n");
        std::__cxx11::string::~string(local_3c0);
        std::__cxx11::string::~string(local_3e0);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_440);
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::string::~string((string *)&local_470);
        if (*(int *)(&DAT_018d0d80 + lVar10) == 0) {
          DVar1 = *(DataType *)(&DAT_018d0d90 + lVar10);
          if (DVar1 != TYPE_LAST) {
            poVar7 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,
                                     "\tmediump ");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_470,"comp",(allocator<char> *)&local_440);
            declareAndInitializeShaderVariable((string *)&local_320,DVar1,&local_470);
            poVar7 = std::operator<<(poVar7,(string *)&local_320);
            std::operator<<(poVar7,"\ttextureGatherOffsets(sampler, P, offsets, comp);\n");
            std::__cxx11::string::~string((string *)&local_320);
            goto LAB_01369abe;
          }
          std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\ttextureGatherOffsets(sampler, P, offsets);\n");
        }
        else if (*(int *)(&DAT_018d0d80 + lVar10) == 1) {
          poVar7 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,
                                   "\tmediump ");
          DVar1 = *(DataType *)(&DAT_018d0d90 + lVar10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_470,"refZ",(allocator<char> *)&local_440);
          declareAndInitializeShaderVariable((string *)&local_320,DVar1,&local_470);
          poVar7 = std::operator<<(poVar7,(string *)&local_320);
          std::operator<<(poVar7,"\ttextureGatherOffsets(sampler, P, refZ, offsets);\n");
          std::__cxx11::string::~string((string *)&local_320);
LAB_01369abe:
          std::__cxx11::string::~string((string *)&local_470);
        }
        std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
        std::__cxx11::string::string((string *)&local_340,(string *)&shaderSource);
        verifyShader(ctx,local_47c,&local_340);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&shaderSource);
        local_478 = local_478 + 1;
      }
      NegativeTestContext::endSection(ctx);
      lVar10 = local_450;
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

void texture_gather_offsets (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported("GL_EXT_gpu_shader5"),
		"This test requires a context version 3.2 or higher.");

	const struct TextureGatherOffsetsTestSpec testSpecs[] =
	{
			//mode										samplerDataType						pDataType				offsetsDataType			fourthArgument		offsetIsConst	offsetArraySize
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT,			glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT,			glu::TYPE_INT,		true,			4,		},

		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT,			glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT,			glu::TYPE_INT,		true,			4,		},

		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT,			glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},

		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT,			glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},
	};

	ctx.beginSection("textureGatherOffsets");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int specNdx = 0; specNdx < DE_LENGTH_OF_ARRAY(testSpecs); ++specNdx)
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffsets(ctx, s_shaders[shaderNdx], testSpecs[specNdx]));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}